

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcWall::IfcWall(IfcWall *this,void **vtt)

{
  void *pvVar1;
  
  IfcBuildingElement::IfcBuildingElement(&this->super_IfcBuildingElement,vtt + 1);
  pvVar1 = vtt[0x28];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = pvVar1;
  *(void **)(&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x29];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject =
       pvVar1;
  *(void **)(&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
              field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x88 = vtt[0x2b];
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0xd0 = vtt[0x2d];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       vtt[0x2e];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = vtt[0x2f];
  *(void **)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = vtt[0x30];
  return;
}

Assistant:

IfcWall() : Object("IfcWall") {}